

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::BeginFunctionBody
          (BinaryReaderObjdump *this,Index index,Offset size)

{
  bool bVar1;
  size_type sVar2;
  const_pointer pcVar3;
  undefined1 local_38 [8];
  string_view name;
  Offset size_local;
  Index index_local;
  BinaryReaderObjdump *this_local;
  
  name.size_ = size;
  PrintDetails(this," - func[%u] size=%zd",(ulong)index,size);
  _local_38 = BinaryReaderObjdumpBase::GetFunctionName(&this->super_BinaryReaderObjdumpBase,index);
  bVar1 = string_view::empty((string_view *)local_38);
  if (!bVar1) {
    sVar2 = string_view::length((string_view *)local_38);
    pcVar3 = string_view::data((string_view *)local_38);
    PrintDetails(this," <%.*s>",sVar2 & 0xffffffff,pcVar3);
  }
  PrintDetails(this,"\n");
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::BeginFunctionBody(Index index, Offset size) {
  PrintDetails(" - func[%" PRIindex "] size=%" PRIzd, index, size);
  auto name = GetFunctionName(index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  PrintDetails("\n");
  return Result::Ok;
}